

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O3

void __thiscall fmp4_stream::emsg::emsg(emsg *this)

{
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (this->super_full_box).super_box.size_ = 0;
  (this->super_full_box).super_box.large_size_ = 0;
  (this->super_full_box).super_box.box_type_._M_dataplus._M_p =
       (pointer)&(this->super_full_box).super_box.box_type_.field_2;
  (this->super_full_box).super_box.box_type_._M_string_length = 0;
  (this->super_full_box).super_box.box_type_.field_2._M_local_buf[0] = '\0';
  (this->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->super_full_box).super_box.field_0x62 = 0;
  *(undefined8 *)&(this->super_full_box).super_box.field_0x64 = 0;
  (this->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_00127558;
  (this->scheme_id_uri_)._M_dataplus._M_p = (pointer)&(this->scheme_id_uri_).field_2;
  (this->scheme_id_uri_)._M_string_length = 0;
  (this->scheme_id_uri_).field_2._M_local_buf[0] = '\0';
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  (this->value_)._M_string_length = 0;
  (this->value_).field_2._M_local_buf[0] = '\0';
  this->presentation_time_delta_ = 0;
  (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  zero_set(this);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"emsg","");
  std::__cxx11::string::operator=
            ((string *)&(this->super_full_box).super_box.box_type_,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return;
}

Assistant:

emsg() : presentation_time_delta_(0)
		{ 
			zero_set();
			this->box_type_ = std::string("emsg"); 
		}